

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

int get_mean_dev_features(int16_t *data,int stride,int bw,int bh,float *features)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  float *pfVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint in_XMM4_Db;
  uint in_XMM4_Dc;
  uint in_XMM4_Dd;
  int x_sum;
  int64_t x2_sum;
  float local_dc;
  int local_d4;
  int local_ac;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float *local_80;
  float *local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  int16_t *local_50;
  long local_48;
  double local_40;
  long local_38;
  
  uVar6 = bh >> (bw <= bh);
  uVar4 = bw >> (bh <= bw);
  if (bh < 1) {
    fVar12 = 2.8026e-45;
    fVar14 = 0.0;
    fVar9 = 0.0;
    local_dc = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    in_XMM4_Db = 0;
    in_XMM4_Dc = 0;
    in_XMM4_Dd = 0;
  }
  else {
    local_40 = (double)(int)(uVar4 * uVar6);
    local_60 = (ulong)uVar6;
    local_70 = (ulong)(uint)bh;
    local_68 = (long)stride * local_60 * 2;
    local_48 = (ulong)uVar4 * 2;
    local_78 = features + 1;
    fVar14 = 0.0;
    uVar3 = 0;
    fVar12 = 2.8026e-45;
    local_d4 = 0;
    lVar8 = 0;
    local_dc = 0.0;
    fVar9 = 0.0;
    local_80 = features;
    do {
      local_58 = uVar3;
      local_50 = data;
      if (0 < bw) {
        pfVar7 = local_78 + (int)fVar12;
        iVar5 = 0;
        do {
          local_a8 = fVar9;
          local_98 = fVar12;
          (*aom_get_blk_sse_sum)(data,stride,uVar4,uVar6,&local_ac,&local_38);
          lVar2 = local_38;
          iVar1 = local_ac;
          fVar12 = (float)local_ac / (float)(int)(uVar4 * uVar6);
          fVar11 = (float)((double)local_38 / local_40) - fVar12 * fVar12;
          fVar10 = 0.0;
          if (0.0 < fVar11) {
            if (fVar11 < 0.0) {
              fVar10 = sqrtf(fVar11);
            }
            else {
              fVar10 = SQRT(fVar11);
            }
          }
          local_d4 = local_d4 + iVar1;
          lVar8 = lVar8 + lVar2;
          pfVar7[-1] = fVar12;
          *pfVar7 = fVar10;
          fVar14 = fVar14 + fVar12 * fVar12;
          local_dc = local_dc + fVar10;
          fVar9 = (float)((int)local_a8 + 1);
          data = (int16_t *)((long)data + local_48);
          iVar5 = iVar5 + uVar4;
          pfVar7 = pfVar7 + 2;
          fVar12 = (float)((int)local_98 + 2);
        } while (iVar5 < bw);
      }
      uVar3 = local_58 + local_60;
      data = (int16_t *)((long)local_50 + local_68);
    } while (uVar3 < local_70);
    fVar11 = (float)local_d4;
    fVar10 = (float)lVar8;
    features = local_80;
  }
  fVar15 = 0.0;
  fVar11 = fVar11 / (float)(bh * bw);
  *features = fVar11;
  fVar13 = -fVar11;
  fVar10 = fVar10 / (float)(bh * bw) - fVar11 * fVar11;
  if (0.0 < fVar10) {
    if (fVar10 < 0.0) {
      local_a8 = fVar13;
      uStack_a4 = in_XMM4_Db ^ 0x80000000;
      uStack_a0 = in_XMM4_Dc ^ 0x80000000;
      uStack_9c = in_XMM4_Dd ^ 0x80000000;
      local_98 = fVar11;
      uStack_94 = in_XMM4_Db;
      uStack_90 = in_XMM4_Dc;
      uStack_8c = in_XMM4_Dd;
      fVar15 = sqrtf(fVar10);
      fVar13 = local_a8;
      fVar11 = local_98;
    }
    else {
      fVar15 = SQRT(fVar10);
    }
  }
  features[1] = fVar15;
  fVar14 = fVar13 * fVar11 + fVar14 / (float)(int)fVar9;
  fVar10 = 0.0;
  if (0.0 < fVar14) {
    if (fVar14 < 0.0) {
      fVar10 = sqrtf(fVar14);
    }
    else {
      fVar10 = SQRT(fVar14);
    }
  }
  features[(int)fVar12] = fVar10;
  features[(long)(int)fVar12 + 1] = local_dc / (float)(int)fVar9;
  return (int)fVar12 + 2;
}

Assistant:

static inline int get_mean_dev_features(const int16_t *data, int stride, int bw,
                                        int bh, float *features) {
  const int16_t *const data_ptr = &data[0];
  const int subh = (bh >= bw) ? (bh >> 1) : bh;
  const int subw = (bw >= bh) ? (bw >> 1) : bw;
  const int num = bw * bh;
  const int sub_num = subw * subh;
  int feature_idx = 2;
  int total_x_sum = 0;
  int64_t total_x2_sum = 0;
  int num_sub_blks = 0;
  double mean2_sum = 0.0f;
  float dev_sum = 0.0f;

  for (int row = 0; row < bh; row += subh) {
    for (int col = 0; col < bw; col += subw) {
      int x_sum;
      int64_t x2_sum;
      // TODO(any): Write a SIMD version. Clear registers.
      aom_get_blk_sse_sum(data_ptr + row * stride + col, stride, subw, subh,
                          &x_sum, &x2_sum);
      total_x_sum += x_sum;
      total_x2_sum += x2_sum;

      const float mean = (float)x_sum / sub_num;
      const float dev = get_dev(mean, (double)x2_sum, sub_num);
      features[feature_idx++] = mean;
      features[feature_idx++] = dev;
      mean2_sum += (double)(mean * mean);
      dev_sum += dev;
      num_sub_blks++;
    }
  }

  const float lvl0_mean = (float)total_x_sum / num;
  features[0] = lvl0_mean;
  features[1] = get_dev(lvl0_mean, (double)total_x2_sum, num);

  // Deviation of means.
  features[feature_idx++] = get_dev(lvl0_mean, mean2_sum, num_sub_blks);
  // Mean of deviations.
  features[feature_idx++] = dev_sum / num_sub_blks;

  return feature_idx;
}